

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

size_t tcg_code_size_mips64(TCGContext_conflict5 *tcg_ctx)

{
  ulong uVar1;
  
  uVar1 = (long)tcg_ctx->code_gen_ptr - (long)tcg_ctx->code_gen_buffer;
  if (uVar1 <= tcg_ctx->code_gen_buffer_size) {
    return uVar1 + (tcg_ctx->region).agg_size_full;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
             ,0x22f,"size <= tcg_ctx->code_gen_buffer_size");
}

Assistant:

size_t tcg_code_size(TCGContext *tcg_ctx)
{
    size_t total;
    size_t size;

    total = tcg_ctx->region.agg_size_full;

    size = (char *)tcg_ctx->code_gen_ptr - (char *)tcg_ctx->code_gen_buffer;
    g_assert(size <= tcg_ctx->code_gen_buffer_size);
    total += size;

    return total;
}